

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_ulong.c
# Opt level: O0

uint scan_ulong(char *s,unsigned_long *u)

{
  ulong uVar1;
  unsigned_long c;
  unsigned_long result;
  uint pos;
  unsigned_long *u_local;
  char *s_local;
  
  result._4_4_ = 0;
  c = 0;
  while (uVar1 = (ulong)((int)s[result._4_4_] - 0x30U & 0xff), uVar1 < 10) {
    c = c * 10 + uVar1;
    result._4_4_ = result._4_4_ + 1;
  }
  *u = c;
  return result._4_4_;
}

Assistant:

unsigned int scan_ulong(register const char *s,register unsigned long *u)
{
  register unsigned int pos = 0;
  register unsigned long result = 0;
  register unsigned long c;
  while ((c = (unsigned long) (unsigned char) (s[pos] - '0')) < 10) {
    result = result * 10 + c;
    ++pos;
  }
  *u = result;
  return pos;
}